

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::array<int,4ul>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,array<int,_4UL> *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<std::array<int,_4UL>_> local_8c;
  undefined1 local_78 [8];
  optional<std::array<int,_4UL>_> pv_1;
  undefined1 local_4c [8];
  optional<std::array<int,_4UL>_> pv;
  array<int,_4UL> *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (array<int,_4UL> *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_007b0dcc;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&pv.contained + 8),t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&pv.contained + 8));
  if (bVar1) {
    get_default_value<std::array<int,4ul>>
              ((optional<std::array<int,_4UL>_> *)((long)&pv_1.contained + 0xc),this);
    nonstd::optional_lite::optional<std::array<int,_4UL>_>::optional<std::array<int,_4UL>,_0>
              ((optional<std::array<int,_4UL>_> *)local_4c,
               (optional<std::array<int,_4UL>_> *)((long)&pv_1.contained + 0xc));
    nonstd::optional_lite::optional<std::array<int,_4UL>_>::~optional
              ((optional<std::array<int,_4UL>_> *)((long)&pv_1.contained + 0xc));
    pv_1.contained._8_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_4c);
    if ((bool)pv_1.contained._8_1_) {
      pvVar2 = nonstd::optional_lite::optional<std::array<int,_4UL>_>::value
                         ((optional<std::array<int,_4UL>_> *)local_4c);
      *(undefined8 *)v->_M_elems = *(undefined8 *)pvVar2->_M_elems;
      *(undefined8 *)(v->_M_elems + 2) = *(undefined8 *)(pvVar2->_M_elems + 2);
      this_local._7_1_ = 1;
    }
    pv_1.contained._9_3_ = 0;
    nonstd::optional_lite::optional<std::array<int,_4UL>_>::~optional
              ((optional<std::array<int,_4UL>_> *)local_4c);
    if (pv_1.contained._8_4_ != 0) goto LAB_007b0dcc;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_007b0dcc;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<std::array<int,_4UL>,_nullptr>(&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<std::array<int,4ul>>(&local_8c,this);
      nonstd::optional_lite::optional<std::array<int,_4UL>_>::optional<std::array<int,_4UL>,_0>
                ((optional<std::array<int,_4UL>_> *)local_78,&local_8c);
      nonstd::optional_lite::optional<std::array<int,_4UL>_>::~optional(&local_8c);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_78);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<std::array<int,_4UL>_>::value
                           ((optional<std::array<int,_4UL>_> *)local_78);
        *(undefined8 *)v->_M_elems = *(undefined8 *)pvVar2->_M_elems;
        *(undefined8 *)(v->_M_elems + 2) = *(undefined8 *)(pvVar2->_M_elems + 2);
        this_local._7_1_ = 1;
      }
      pv_1.contained._9_3_ = 0;
      pv_1.contained._8_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<int,_4UL>_>::~optional
                ((optional<std::array<int,_4UL>_> *)local_78);
      if (pv_1.contained._8_4_ != 0) goto LAB_007b0dcc;
    }
    this_local._7_1_ = 0;
  }
LAB_007b0dcc:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }